

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O2

int stbtt_FindGlyphIndex(stbtt_fontinfo *info,int unicode_codepoint)

{
  uchar *puVar1;
  stbtt_uint32 sVar2;
  ushort uVar3;
  stbtt_uint32 sVar4;
  stbtt_uint32 sVar5;
  stbtt_uint32 sVar6;
  ulong uVar7;
  long lVar8;
  ushort uVar9;
  uint uVar10;
  ulong uVar11;
  ushort uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  stbtt_uint8 *p;
  uint uVar17;
  bool bVar18;
  
  puVar1 = info->data;
  uVar10 = info->index_map;
  uVar7 = (ulong)uVar10;
  uVar3 = *(ushort *)(puVar1 + uVar7) << 8;
  uVar12 = *(ushort *)(puVar1 + uVar7) >> 8;
  uVar9 = uVar3 | uVar12;
  switch(uVar9) {
  case 0:
    if (unicode_codepoint <
        (int)((ushort)(*(ushort *)(puVar1 + uVar7 + 2) << 8 | *(ushort *)(puVar1 + uVar7 + 2) >> 8)
             - 6)) {
      return (uint)puVar1[(long)unicode_codepoint + uVar7 + 6];
    }
    break;
  default:
    if ((uVar3 | uVar12 & 0xfffe) != 0xc) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imstb_truetype.h"
                    ,0x60e,"int stbtt_FindGlyphIndex(const stbtt_fontinfo *, int)");
    }
    sVar4 = ttULONG(puVar1 + uVar7 + 0xc);
    iVar16 = 0;
    while (sVar2 = sVar4, sVar2 - iVar16 != 0 && iVar16 <= (int)sVar2) {
      sVar4 = ((int)(sVar2 - iVar16) >> 1) + iVar16;
      p = puVar1 + (long)(int)(sVar4 * 0xc) + uVar7 + 0x10;
      sVar5 = ttULONG(p);
      if (sVar5 <= (uint)unicode_codepoint) {
        sVar6 = ttULONG(p + 4);
        if ((uint)unicode_codepoint <= sVar6) {
          sVar4 = ttULONG(p + 8);
          iVar16 = 0;
          if (uVar9 == 0xc) {
            iVar16 = unicode_codepoint - sVar5;
          }
          return iVar16 + sVar4;
        }
        iVar16 = sVar4 + 1;
        sVar4 = sVar2;
      }
    }
    break;
  case 2:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imstb_truetype.h"
                  ,0x5c7,"int stbtt_FindGlyphIndex(const stbtt_fontinfo *, int)");
  case 4:
    if (unicode_codepoint < 0x10000) {
      uVar3 = *(ushort *)(puVar1 + uVar7 + 6) << 8 | *(ushort *)(puVar1 + uVar7 + 6) >> 8;
      uVar12 = *(ushort *)(puVar1 + uVar7 + 10) << 8 | *(ushort *)(puVar1 + uVar7 + 10) >> 8;
      uVar13 = (uint)(ushort)(*(ushort *)(puVar1 + uVar7 + 8) << 8 |
                             *(ushort *)(puVar1 + uVar7 + 8) >> 8);
      uVar15 = (ulong)(puVar1[uVar7 + 0xd] & 0xfffffffe) | (ulong)puVar1[uVar7 + 0xc] << 8;
      if (unicode_codepoint <
          (int)(uint)(ushort)(*(ushort *)(puVar1 + uVar15 + (uVar10 + 0xe)) << 8 |
                             *(ushort *)(puVar1 + uVar15 + (uVar10 + 0xe)) >> 8)) {
        uVar15 = 0;
      }
      uVar17 = uVar10 + (int)uVar15 + 0xc;
      while (bVar18 = uVar12 != 0, uVar12 = uVar12 - 1, bVar18) {
        uVar13 = uVar13 >> 1;
        uVar14 = uVar13 & 0xfffffffe;
        if (unicode_codepoint <=
            (int)(uint)(ushort)(*(ushort *)(puVar1 + (ulong)uVar14 + (ulong)uVar17) << 8 |
                               *(ushort *)(puVar1 + (ulong)uVar14 + (ulong)uVar17) >> 8)) {
          uVar14 = 0;
        }
        uVar17 = uVar14 + uVar17;
      }
      uVar15 = (ulong)((uVar17 - uVar10) + 0x1fff4 & 0x1fffe);
      if (unicode_codepoint <=
          (int)(uint)(ushort)(*(ushort *)(puVar1 + uVar15 + (uVar10 + 0xe)) << 8 |
                             *(ushort *)(puVar1 + uVar15 + (uVar10 + 0xe)) >> 8)) {
        uVar10 = 0;
        uVar13 = (uint)(ushort)(*(ushort *)(puVar1 + uVar15 + (uVar3 & 0xfffffffe) + uVar7 + 0x10)
                                << 8 | *(ushort *)
                                        (puVar1 + uVar15 + (uVar3 & 0xfffffffe) + uVar7 + 0x10) >> 8
                               );
        if ((int)uVar13 <= unicode_codepoint) {
          uVar11 = (ulong)(uVar3 >> 1);
          lVar8 = uVar11 * 6;
          uVar3 = *(ushort *)(puVar1 + uVar15 + 2 + lVar8 + uVar7 + 0xe) << 8 |
                  *(ushort *)(puVar1 + uVar15 + 2 + lVar8 + uVar7 + 0xe) >> 8;
          if (uVar3 == 0) {
            uVar10 = (uint)(ushort)(*(ushort *)(puVar1 + uVar15 + 2 + uVar11 * 4 + uVar7 + 0xe) << 8
                                   | *(ushort *)(puVar1 + uVar15 + 2 + uVar11 * 4 + uVar7 + 0xe) >>
                                     8) + unicode_codepoint;
          }
          else {
            uVar10 = (uint)(ushort)(*(ushort *)
                                     (puVar1 + uVar15 + 0x10 +
                                               uVar7 + lVar8 +
                                               (long)(int)((unicode_codepoint - uVar13) * 2) +
                                               (ulong)uVar3) << 8 |
                                   *(ushort *)
                                    (puVar1 + uVar15 + 0x10 +
                                              uVar7 + lVar8 +
                                              (long)(int)((unicode_codepoint - uVar13) * 2) +
                                              (ulong)uVar3) >> 8);
          }
        }
        return uVar10 & 0xffff;
      }
      __assert_fail("unicode_codepoint <= ttUSHORT(data + endCount + 2*item)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imstb_truetype.h"
                    ,0x5eb,"int stbtt_FindGlyphIndex(const stbtt_fontinfo *, int)");
    }
    break;
  case 6:
    uVar3 = *(ushort *)(puVar1 + uVar7 + 6) << 8 | *(ushort *)(puVar1 + uVar7 + 6) >> 8;
    if ((uint)unicode_codepoint < (uint)uVar3) {
      return 0;
    }
    if ((uint)(ushort)(*(ushort *)(puVar1 + uVar7 + 8) << 8 | *(ushort *)(puVar1 + uVar7 + 8) >> 8)
        + (uint)uVar3 <= (uint)unicode_codepoint) {
      return 0;
    }
    return (uint)(ushort)(*(ushort *)
                           (puVar1 + (ulong)((unicode_codepoint - (uint)uVar3) * 2) + uVar7 + 10) <<
                          8 | *(ushort *)
                               (puVar1 + (ulong)((unicode_codepoint - (uint)uVar3) * 2) + uVar7 + 10
                               ) >> 8);
  }
  return 0;
}

Assistant:

STBTT_DEF int stbtt_FindGlyphIndex(const stbtt_fontinfo *info, int unicode_codepoint)
{
   stbtt_uint8 *data = info->data;
   stbtt_uint32 index_map = info->index_map;

   stbtt_uint16 format = ttUSHORT(data + index_map + 0);
   if (format == 0) { // apple byte encoding
      stbtt_int32 bytes = ttUSHORT(data + index_map + 2);
      if (unicode_codepoint < bytes-6)
         return ttBYTE(data + index_map + 6 + unicode_codepoint);
      return 0;
   } else if (format == 6) {
      stbtt_uint32 first = ttUSHORT(data + index_map + 6);
      stbtt_uint32 count = ttUSHORT(data + index_map + 8);
      if ((stbtt_uint32) unicode_codepoint >= first && (stbtt_uint32) unicode_codepoint < first+count)
         return ttUSHORT(data + index_map + 10 + (unicode_codepoint - first)*2);
      return 0;
   } else if (format == 2) {
      STBTT_assert(0); // @TODO: high-byte mapping for japanese/chinese/korean
      return 0;
   } else if (format == 4) { // standard mapping for windows fonts: binary search collection of ranges
      stbtt_uint16 segcount = ttUSHORT(data+index_map+6) >> 1;
      stbtt_uint16 searchRange = ttUSHORT(data+index_map+8) >> 1;
      stbtt_uint16 entrySelector = ttUSHORT(data+index_map+10);
      stbtt_uint16 rangeShift = ttUSHORT(data+index_map+12) >> 1;

      // do a binary search of the segments
      stbtt_uint32 endCount = index_map + 14;
      stbtt_uint32 search = endCount;

      if (unicode_codepoint > 0xffff)
         return 0;

      // they lie from endCount .. endCount + segCount
      // but searchRange is the nearest power of two, so...
      if (unicode_codepoint >= ttUSHORT(data + search + rangeShift*2))
         search += rangeShift*2;

      // now decrement to bias correctly to find smallest
      search -= 2;
      while (entrySelector) {
         stbtt_uint16 end;
         searchRange >>= 1;
         end = ttUSHORT(data + search + searchRange*2);
         if (unicode_codepoint > end)
            search += searchRange*2;
         --entrySelector;
      }
      search += 2;

      {
         stbtt_uint16 offset, start;
         stbtt_uint16 item = (stbtt_uint16) ((search - endCount) >> 1);

         STBTT_assert(unicode_codepoint <= ttUSHORT(data + endCount + 2*item));
         start = ttUSHORT(data + index_map + 14 + segcount*2 + 2 + 2*item);
         if (unicode_codepoint < start)
            return 0;

         offset = ttUSHORT(data + index_map + 14 + segcount*6 + 2 + 2*item);
         if (offset == 0)
            return (stbtt_uint16) (unicode_codepoint + ttSHORT(data + index_map + 14 + segcount*4 + 2 + 2*item));

         return ttUSHORT(data + offset + (unicode_codepoint-start)*2 + index_map + 14 + segcount*6 + 2 + 2*item);
      }
   } else if (format == 12 || format == 13) {
      stbtt_uint32 ngroups = ttULONG(data+index_map+12);
      stbtt_int32 low,high;
      low = 0; high = (stbtt_int32)ngroups;
      // Binary search the right group.
      while (low < high) {
         stbtt_int32 mid = low + ((high-low) >> 1); // rounds down, so low <= mid < high
         stbtt_uint32 start_char = ttULONG(data+index_map+16+mid*12);
         stbtt_uint32 end_char = ttULONG(data+index_map+16+mid*12+4);
         if ((stbtt_uint32) unicode_codepoint < start_char)
            high = mid;
         else if ((stbtt_uint32) unicode_codepoint > end_char)
            low = mid+1;
         else {
            stbtt_uint32 start_glyph = ttULONG(data+index_map+16+mid*12+8);
            if (format == 12)
               return start_glyph + unicode_codepoint-start_char;
            else // format == 13
               return start_glyph;
         }
      }
      return 0; // not found
   }
   // @TODO
   STBTT_assert(0);
   return 0;
}